

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void __thiscall Server::process_waiting_for_resolve(Server *this)

{
  ushort uVar1;
  DNSResolver *this_00;
  _List_node_base *p_Var2;
  bool bVar3;
  int forwarding_socket;
  int iVar4;
  long lVar5;
  Connection *this_01;
  runtime_error *this_02;
  _Self __tmp;
  const_iterator __position;
  allocator local_69;
  sockaddr_in addr;
  Connection *local_50 [4];
  
  __position._M_node =
       (this->waitingForResolve).
       super__List_base<std::pair<std::pair<int,_int>,_DNSResolver_*>,_std::allocator<std::pair<std::pair<int,_int>,_DNSResolver_*>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  while( true ) {
    while( true ) {
      if (__position._M_node == (_List_node_base *)&this->waitingForResolve) {
        return;
      }
      bVar3 = DNSResolver::exchange_data
                        ((DNSResolver *)__position._M_node[1]._M_prev,&this->rdfds,&this->wrfds);
      if (bVar3) break;
      iVar4 = DNSResolver::getfd((DNSResolver *)__position._M_node[1]._M_prev);
      if (iVar4 < this->maxfd) {
        iVar4 = this->maxfd;
      }
      this->maxfd = iVar4;
      __position._M_node = (__position._M_node)->_M_next;
    }
    forwarding_socket = socket(2,1,0);
    addr.sin_family = 0;
    addr.sin_port = 0;
    addr.sin_addr.s_addr = 0;
    addr.sin_zero[0] = '\0';
    addr.sin_zero[1] = '\0';
    addr.sin_zero[2] = '\0';
    addr.sin_zero[3] = '\0';
    addr.sin_zero[4] = '\0';
    addr.sin_zero[5] = '\0';
    addr.sin_zero[6] = '\0';
    addr.sin_zero[7] = '\0';
    lVar5 = DNSResolver::getaddr((DNSResolver *)__position._M_node[1]._M_prev);
    uVar1 = *(ushort *)((long)&__position._M_node[1]._M_next + 4);
    addr.sin_addr.s_addr = (int)lVar5;
    addr.sin_port = uVar1 << 8 | uVar1 >> 8;
    addr.sin_family = 2;
    this_01 = (Connection *)operator_new(0x68);
    Connection::Connection(this_01,*(int *)&__position._M_node[1]._M_next,forwarding_socket,&addr);
    local_50[0] = this_01;
    std::__cxx11::list<Connection_*,_std::allocator<Connection_*>_>::push_back
              (&this->connections,local_50);
    iVar4 = this->maxfd;
    if (this->maxfd <= forwarding_socket) {
      iVar4 = forwarding_socket;
    }
    this->maxfd = iVar4;
    if (0x3ff < forwarding_socket) break;
    this_00 = (DNSResolver *)__position._M_node[1]._M_prev;
    if (this_00 != (DNSResolver *)0x0) {
      DNSResolver::~DNSResolver(this_00);
    }
    operator_delete(this_00);
    p_Var2 = (__position._M_node)->_M_next;
    std::__cxx11::
    list<std::pair<std::pair<int,_int>,_DNSResolver_*>,_std::allocator<std::pair<std::pair<int,_int>,_DNSResolver_*>_>_>
    ::erase(&this->waitingForResolve,__position);
    __position._M_node = p_Var2;
  }
  this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string((string *)local_50,"Socket number out of range for select",&local_69)
  ;
  std::runtime_error::runtime_error(this_02,(string *)local_50);
  __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Server::process_waiting_for_resolve() {
    for (auto i = waitingForResolve.begin();i!=waitingForResolve.end();) {
        if (i->second->exchange_data(rdfds, wrfds)) {
            int forwarding_socket = socket(AF_INET, SOCK_STREAM, 0);
            sockaddr_in addr;
            memset(&addr, 0, sizeof(addr));
            addr.sin_addr.s_addr = i->second->getaddr();
            addr.sin_port = htons(i->first.second);
            addr.sin_family = AF_INET;
            connections.push_back(new Connection(i->first.first, forwarding_socket, &addr));
            if (!add_fd(forwarding_socket)) {
                throw std::runtime_error(std::string("Socket number out of range for select"));
            }
            delete(i->second);
            waitingForResolve.erase(i++);
        }else{
            add_fd(i->second->getfd());
            i++;
        }
    }

}